

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Neuron.cpp
# Opt level: O3

void __thiscall Neuron::connectTo(Neuron *this,Neuron *target,float weight)

{
  pointer *ppCVar1;
  iterator __position;
  Connection local_18;
  
  local_18.m_max = 100.0;
  local_18.m_expire = 100.0;
  __position._M_current =
       (this->m_connections).super__Vector_base<Connection,_std::allocator<Connection>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_connections).super__Vector_base<Connection,_std::allocator<Connection>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_18.m_target = target;
    local_18.m_weight = weight;
    std::vector<Connection,_std::allocator<Connection>_>::_M_realloc_insert<Connection>
              (&this->m_connections,__position,&local_18);
  }
  else {
    *(ulong *)&(__position._M_current)->m_expire = CONCAT44(local_18._20_4_,0x42c80000);
    (__position._M_current)->m_target = target;
    (__position._M_current)->m_weight = weight;
    (__position._M_current)->m_max = 100.0;
    ppCVar1 = &(this->m_connections).super__Vector_base<Connection,_std::allocator<Connection>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppCVar1 = *ppCVar1 + 1;
  }
  return;
}

Assistant:

void Neuron::connectTo(Neuron* target, float weight)
{
    m_connections.push_back({target, weight});
}